

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O2

void __thiscall blc::tools::VFile::seekg(VFile *this,int pos)

{
  exception *this_00;
  allocator<char> local_39;
  string local_38;
  
  if ((ulong)(long)pos <= (this->_cache)._M_string_length) {
    this->_cursor = pos;
    return;
  }
  this_00 = (exception *)__cxa_allocate_exception(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Impossible to modify cursor (value to hight)",&local_39);
  error::exception::exception(this_00,&local_38);
  __cxa_throw(this_00,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::tools::VFile::seekg(const int pos) {
	if (pos > this->_cache.size())
		throw blc::error::exception("Impossible to modify cursor (value to hight)");
	else
		this->_cursor = pos;
}